

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O0

BufferViewWrapper * __thiscall
Diligent::BufferVkImpl::CreateView
          (BufferViewWrapper *__return_storage_ptr__,BufferVkImpl *this,BufferViewDesc *ViewDesc)

{
  RenderDeviceVkImpl *pRVar1;
  GraphicsAdapterInfo *pGVar2;
  Char *Message;
  BufferViewWrapper local_b8;
  VulkanLogicalDevice *local_a0;
  VulkanLogicalDevice *LogicalDevice;
  string msg;
  VkBufferViewCreateInfo ViewCI;
  BufferViewDesc *ViewDesc_local;
  BufferVkImpl *this_local;
  BufferViewWrapper *BuffView;
  
  VulkanUtilities::VulkanObjectWrapper<VkBufferView_T_*,_(VulkanUtilities::VulkanHandleTypeId)3>::
  VulkanObjectWrapper(__return_storage_ptr__);
  pRVar1 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)this);
  pGVar2 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar1);
  ValidateAndCorrectBufferViewDesc
            (&(this->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc,ViewDesc,(pGVar2->Buffer).StructuredBufferOffsetAlignment);
  if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Mode == BUFFER_MODE_FORMATTED) {
    msg.field_2._8_8_ = 0xd;
    VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
              ((VulkanObjectWrapper *)&this->m_VulkanBuffer);
    if ((ViewDesc->Format).ValueType == VT_UNDEFINED) {
      FormatString<char[17]>((string *)&LogicalDevice,(char (*) [17])"Undefined format");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"CreateView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x206);
      std::__cxx11::string::~string((string *)&LogicalDevice);
    }
    TypeToVkFormat((ViewDesc->Format).ValueType,(uint)(ViewDesc->Format).NumComponents,
                   (Bool)((ViewDesc->Format).IsNormalized & 1));
    pRVar1 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          *)this);
    local_a0 = RenderDeviceVkImpl::GetLogicalDevice(pRVar1);
    VulkanUtilities::VulkanLogicalDevice::CreateBufferView
              (&local_b8,local_a0,(VkBufferViewCreateInfo *)((long)&msg.field_2 + 8),
               (ViewDesc->super_DeviceObjectAttribs).Name);
    VulkanUtilities::VulkanObjectWrapper<VkBufferView_T_*,_(VulkanUtilities::VulkanHandleTypeId)3>::
    operator=(__return_storage_ptr__,&local_b8);
    VulkanUtilities::VulkanObjectWrapper<VkBufferView_T_*,_(VulkanUtilities::VulkanHandleTypeId)3>::
    ~VulkanObjectWrapper(&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

VulkanUtilities::BufferViewWrapper BufferVkImpl::CreateView(struct BufferViewDesc& ViewDesc)
{
    VulkanUtilities::BufferViewWrapper BuffView;
    ValidateAndCorrectBufferViewDesc(m_Desc, ViewDesc, GetDevice()->GetAdapterInfo().Buffer.StructuredBufferOffsetAlignment);
    if (m_Desc.Mode == BUFFER_MODE_FORMATTED)
    {
        VkBufferViewCreateInfo ViewCI{};
        ViewCI.sType  = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
        ViewCI.pNext  = nullptr;
        ViewCI.flags  = 0; // reserved for future use
        ViewCI.buffer = m_VulkanBuffer;
        DEV_CHECK_ERR(ViewDesc.Format.ValueType != VT_UNDEFINED, "Undefined format");
        ViewCI.format = TypeToVkFormat(ViewDesc.Format.ValueType, ViewDesc.Format.NumComponents, ViewDesc.Format.IsNormalized);
        ViewCI.offset = ViewDesc.ByteOffset; // offset in bytes from the base address of the buffer
        ViewCI.range  = ViewDesc.ByteWidth;  // size in bytes of the buffer view

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice{GetDevice()->GetLogicalDevice()};
        BuffView = LogicalDevice.CreateBufferView(ViewCI, ViewDesc.Name);
    }
    else if (m_Desc.Mode == BUFFER_MODE_STRUCTURED ||
             m_Desc.Mode == BUFFER_MODE_RAW)
    {
        // Structured and raw buffers are mapped to storage buffers in GLSL
    }

    return BuffView;
}